

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_scalar_three_reg_same_extra(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t srcidx;
  uint32_t srcidx_00;
  uint32_t uVar2;
  uint32_t srcidx_01;
  MemOp memop;
  uint32_t uVar3;
  TCGv_i32 tcg_dest;
  TCGv_i32 tcg_dest_00;
  TCGv_i32 tcg_dest_01;
  TCGv_i64 ret;
  _Bool feature;
  TCGv_i64 res;
  TCGv_i32 ele3;
  TCGv_i32 ele2;
  TCGv_i32 ele1;
  _Bool u;
  int size;
  int rm;
  int opcode;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  srcidx = extract32(insn,0,5);
  srcidx_00 = extract32(insn,5,5);
  uVar2 = extract32(insn,0xb,4);
  srcidx_01 = extract32(insn,0x10,5);
  memop = extract32(insn,0x16,2);
  uVar3 = extract32(insn,0x1d,1);
  if ((uint)(uVar3 != 0) * 0x10 + -0x10 + uVar2 < 2) {
    if ((memop == MO_16) || (memop == MO_32)) {
      _Var1 = isar_feature_aa64_rdm(s->isar);
      if (_Var1) {
        _Var1 = fp_access_check(s);
        if (_Var1) {
          tcg_dest = tcg_temp_new_i32(tcg_ctx_00);
          tcg_dest_00 = tcg_temp_new_i32(tcg_ctx_00);
          tcg_dest_01 = tcg_temp_new_i32(tcg_ctx_00);
          read_vec_element_i32(s,tcg_dest,srcidx_00,0,memop);
          read_vec_element_i32(s,tcg_dest_00,srcidx_01,0,memop);
          read_vec_element_i32(s,tcg_dest_01,srcidx,0,memop);
          if (uVar2 == 0) {
            if (memop == MO_16) {
              gen_helper_neon_qrdmlah_s16
                        (tcg_ctx_00,tcg_dest_01,tcg_ctx_00->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01
                        );
            }
            else {
              gen_helper_neon_qrdmlah_s32
                        (tcg_ctx_00,tcg_dest_01,tcg_ctx_00->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01
                        );
            }
          }
          else {
            if (uVar2 != 1) {
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                         ,0x25bf,(char *)0x0);
            }
            if (memop == MO_16) {
              gen_helper_neon_qrdmlsh_s16
                        (tcg_ctx_00,tcg_dest_01,tcg_ctx_00->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01
                        );
            }
            else {
              gen_helper_neon_qrdmlsh_s32
                        (tcg_ctx_00,tcg_dest_01,tcg_ctx_00->cpu_env,tcg_dest,tcg_dest_00,tcg_dest_01
                        );
            }
          }
          tcg_temp_free_i32(tcg_ctx_00,tcg_dest);
          tcg_temp_free_i32(tcg_ctx_00,tcg_dest_00);
          ret = tcg_temp_new_i64(tcg_ctx_00);
          tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,ret,tcg_dest_01);
          tcg_temp_free_i32(tcg_ctx_00,tcg_dest_01);
          write_fp_dreg_aarch64(s,srcidx,ret);
          tcg_temp_free_i64(tcg_ctx_00,ret);
        }
      }
      else {
        unallocated_encoding_aarch64(s);
      }
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_simd_scalar_three_reg_same_extra(DisasContext *s,
                                                   uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    TCGv_i32 ele1, ele2, ele3;
    TCGv_i64 res;
    bool feature;

    switch (u * 16 + opcode) {
    case 0x10: /* SQRDMLAH (vector) */
    case 0x11: /* SQRDMLSH (vector) */
        if (size != 1 && size != 2) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_rdm, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }
    if (!feature) {
        unallocated_encoding(s);
        return;
    }
    if (!fp_access_check(s)) {
        return;
    }

    /* Do a single operation on the lowest element in the vector.
     * We use the standard Neon helpers and rely on 0 OP 0 == 0
     * with no side effects for all these operations.
     * OPTME: special-purpose helpers would avoid doing some
     * unnecessary work in the helper for the 16 bit cases.
     */
    ele1 = tcg_temp_new_i32(tcg_ctx);
    ele2 = tcg_temp_new_i32(tcg_ctx);
    ele3 = tcg_temp_new_i32(tcg_ctx);

    read_vec_element_i32(s, ele1, rn, 0, size);
    read_vec_element_i32(s, ele2, rm, 0, size);
    read_vec_element_i32(s, ele3, rd, 0, size);

    switch (opcode) {
    case 0x0: /* SQRDMLAH */
        if (size == 1) {
            gen_helper_neon_qrdmlah_s16(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        } else {
            gen_helper_neon_qrdmlah_s32(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        }
        break;
    case 0x1: /* SQRDMLSH */
        if (size == 1) {
            gen_helper_neon_qrdmlsh_s16(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        } else {
            gen_helper_neon_qrdmlsh_s32(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        }
        break;
    default:
        g_assert_not_reached();
    }
    tcg_temp_free_i32(tcg_ctx, ele1);
    tcg_temp_free_i32(tcg_ctx, ele2);

    res = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, res, ele3);
    tcg_temp_free_i32(tcg_ctx, ele3);

    write_fp_dreg(s, rd, res);
    tcg_temp_free_i64(tcg_ctx, res);
}